

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode Curl_resolver_wait_resolv(Curl_easy *data,Curl_dns_entry **entry)

{
  CURLcode CVar1;
  Curl_dns_entry **entry_local;
  Curl_easy *data_local;
  
  CVar1 = thread_wait_resolv(data,entry,true);
  return CVar1;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct Curl_easy *data,
                                   struct Curl_dns_entry **entry)
{
  return thread_wait_resolv(data, entry, TRUE);
}